

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbabilityEval.cpp
# Opt level: O1

void __thiscall
ProbMap::ProbMap(ProbMap *this,int cwL,bool norm,unordered_set<string> *cwds,string2stringVec *mot)

{
  this->codewordLen = cwL;
  this->normalized = norm;
  robin_hood::detail::
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Table(&this->codewords,cwds);
  robin_hood::detail::
  Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Table(&this->motif,mot);
  return;
}

Assistant:

ProbMap::ProbMap(int cwL, bool norm,robin_hood::unordered_set<string>& cwds, string2stringVec& mot):
    codewordLen(cwL),
    normalized(norm),
    codewords(cwds),
    motif(mot)
{}